

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O2

Value * apply_check_smaller_equal_operation(Value *left_value,Value *right_value)

{
  long lVar1;
  long lVar2;
  long lVar3;
  longlong lVar4;
  longlong lVar5;
  Value *pVVar6;
  bool bVar7;
  bool bVar8;
  longdouble lVar9;
  longdouble lVar10;
  
  if (left_value->value_type == ValueTypeIntegerValue) {
    if (right_value->value_type != ValueTypeIntegerValue) {
      if ((right_value->value_type & ~ValueTypeBoolValue) != ValueTypeIntegerValue)
      goto LAB_0010753f;
      lVar10 = (longdouble)*(long *)(left_value + 1);
LAB_00107533:
      lVar9 = *(longdouble *)&right_value[1].linked_variable_count;
LAB_00107536:
      bVar7 = lVar10 <= lVar9;
      goto LAB_00107555;
    }
    lVar1 = *(long *)(left_value + 1);
    lVar2 = *(long *)(right_value + 1);
    bVar8 = SBORROW8(lVar1,lVar2);
    lVar3 = lVar1 - lVar2;
    bVar7 = lVar1 == lVar2;
  }
  else {
    if (((left_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue) &&
       ((right_value->value_type & ~ValueTypeBoolValue) == ValueTypeIntegerValue)) {
      lVar10 = *(longdouble *)&left_value[1].linked_variable_count;
      if (right_value->value_type == ValueTypeFloatValue) goto LAB_00107533;
      lVar9 = (longdouble)*(long *)(right_value + 1);
      goto LAB_00107536;
    }
LAB_0010753f:
    lVar4 = convert_to_integer(left_value);
    lVar5 = convert_to_integer(right_value);
    bVar8 = SBORROW8(lVar4,lVar5);
    lVar3 = lVar4 - lVar5;
    bVar7 = lVar4 == lVar5;
  }
  bVar7 = bVar7 || bVar8 != lVar3 < 0;
LAB_00107555:
  pVVar6 = new_bool_value(bVar7);
  return pVVar6;
}

Assistant:

Value *apply_check_smaller_equal_operation(Value *left_value, Value *right_value) {
  if (left_value->value_type == ValueTypeIntegerValue && right_value->value_type == ValueTypeIntegerValue) {
    return new_bool_value(((IntegerValue *) left_value)->integer_value <= ((IntegerValue *) right_value)->integer_value);
  }
  else if ((left_value->value_type == ValueTypeIntegerValue || left_value->value_type == ValueTypeFloatValue) && (right_value->value_type == ValueTypeIntegerValue || right_value->value_type == ValueTypeFloatValue)) {
    long double left_float, right_float;

    if (left_value->value_type == ValueTypeFloatValue) left_float = ((FloatValue *) left_value)->float_value;
    else left_float = ((IntegerValue *) left_value)->integer_value;

    if (right_value->value_type == ValueTypeFloatValue) right_float = ((FloatValue *) right_value)->float_value;
    else right_float = ((IntegerValue *) right_value)->integer_value;

    return new_bool_value(left_float <= right_float);
  }

  return new_bool_value(convert_to_integer(left_value) <= convert_to_integer(right_value));
}